

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_outlets.h
# Opt level: O3

void * c74::max::outlet_single<long_long>(t_ptr_int outlet_id,longlong value)

{
  t_mock_outlet *this;
  undefined8 *puVar1;
  
  puVar1 = DAT_001144c8;
  do {
    if (puVar1 == (undefined8 *)0x0) {
      return (void *)0x1;
    }
    for (this = (t_mock_outlet *)puVar1[2]; this != (t_mock_outlet *)puVar1[3]; this = this + 1) {
      if (this->m_id == outlet_id) {
        t_mock_outlet::push(this,value);
        return (void *)0x1;
      }
    }
    puVar1 = (undefined8 *)*puVar1;
  } while( true );
}

Assistant:

void *outlet_single(t_ptr_int outlet_id, T value)
{
    for (t_map_object_2_outlet_set::iterator i = g_object_to_outletset.begin(); i != g_object_to_outletset.end(); i++) {
        t_mock_outlets& outletset = i->second;

        for (t_mock_outlet_iter j = outletset.begin(); j != outletset.end(); j++) {
            t_mock_outlet& outlet = *j;

            if (outlet.get_id() == outlet_id) {
                outlet.push(value);
                goto done;
            }
        }
    }
done:
    return (void*)1;
}